

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  pointer *pppFVar1;
  iterator iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  FieldDescriptor *local_38;
  
  if (0 < *(int *)(d + 0x74)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      ListAllFields((Descriptor *)(*(long *)(d + 0x38) + lVar5),fields);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x90;
    } while (lVar4 < *(int *)(d + 0x74));
  }
  iVar3 = *(int *)(d + 0x80);
  if (0 < iVar3) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_38 = (FieldDescriptor *)(*(long *)(d + 0x50) + lVar4);
      iVar2._M_current =
           (fields->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (fields->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)fields,iVar2,&local_38);
        iVar3 = *(int *)(d + 0x80);
      }
      else {
        *iVar2._M_current = local_38;
        pppFVar1 = &(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x98;
    } while (lVar5 < iVar3);
  }
  iVar3 = *(int *)(d + 0x68);
  if (0 < iVar3) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_38 = (FieldDescriptor *)(*(long *)(d + 0x28) + lVar4);
      iVar2._M_current =
           (fields->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (fields->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)fields,iVar2,&local_38);
        iVar3 = *(int *)(d + 0x68);
      }
      else {
        *iVar2._M_current = local_38;
        pppFVar1 = &(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x98;
    } while (lVar5 < iVar3);
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}